

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

char * monster_blow_method_action(blow_method *method,wchar_t midx)

{
  blow_tag_t bVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  char local_518 [8];
  char m_name_1 [80];
  wchar_t local_4bc;
  char local_4b8 [4];
  wchar_t mdesc_mode;
  char m_name [80];
  blow_message *msg;
  monster *pmStack_458;
  wchar_t choice;
  monster *t_mon;
  size_t end;
  char *in_cursor;
  char *tag;
  char *s;
  char *next;
  char buf [1024];
  char local_1c [8];
  char punct [8];
  wchar_t midx_local;
  blow_method *method_local;
  
  builtin_strncpy(local_1c,".!?;:,\'",8);
  punct._0_4_ = midx;
  unique0x10000313 = method;
  memset(&next,0,0x400);
  t_mon = (monster *)0x0;
  pmStack_458 = (monster *)0x0;
  msg._4_4_ = Rand_div(stack0xfffffffffffffff0->num_messages);
  m_name._72_8_ = stack0xfffffffffffffff0->messages;
  if (0 < (int)punct._0_4_) {
    pmStack_458 = (monster *)cave_monster(cave,punct._0_4_);
  }
  while (msg._4_4_ != 0) {
    m_name._72_8_ = *(undefined8 *)(m_name._72_8_ + 8);
    msg._4_4_ = msg._4_4_ - 1;
  }
  end = *(size_t *)m_name._72_8_;
  s = strchr((char *)end,0x7b);
  while (s != (char *)0x0) {
    strnfcat((char *)&next,0x400,(size_t *)&t_mon,"%.*s",(ulong)(uint)((int)s - (int)end),end);
    tag = s;
    do {
      tag = tag + 1;
      bVar4 = false;
      if (*tag != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)(uint)(byte)*tag] & 0x400) != 0;
      }
    } while (bVar4);
    if (*tag == '}') {
      in_cursor = s + 1;
      end = (size_t)(tag + 1);
      bVar1 = blow_tag_lookup(in_cursor);
      if (bVar1 == BLOW_TAG_TARGET) {
        if ((int)punct._0_4_ < 1) {
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"you");
        }
        else {
          local_4bc = L'\x15';
          pcVar3 = strchr(local_1c,(int)*(char *)end);
          if (pcVar3 == (char *)0x0) {
            local_4bc = L'ȕ';
          }
          monster_desc(local_4b8,0x50,pmStack_458,local_4bc);
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"%s",local_4b8);
        }
      }
      else if (bVar1 == BLOW_TAG_OF_TARGET) {
        if ((int)punct._0_4_ < 1) {
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"your");
        }
        else {
          monster_desc(local_518,0x50,pmStack_458,L'\x17');
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"%s",local_518);
        }
      }
      else if (bVar1 == BLOW_TAG_HAS) {
        if ((int)punct._0_4_ < 1) {
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"have");
        }
        else {
          strnfcat((char *)&next,0x400,(size_t *)&t_mon,"has");
        }
      }
    }
    else {
      end = (size_t)(s + 1);
    }
    s = strchr((char *)end,0x7b);
  }
  strnfcat((char *)&next,0x400,(size_t *)&t_mon,"%s",end);
  pcVar3 = string_make((char *)&next);
  return pcVar3;
}

Assistant:

char *monster_blow_method_action(const struct blow_method *method, int midx)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster *t_mon = NULL;

	int choice = randint0(method->num_messages);
	const struct blow_message *msg = method->messages;

	/* Get the target monster, if any */
	if (midx > 0) {
		t_mon = cave_monster(cave, midx);
	}

	/* Pick a message */
	while (choice--) {
		msg = msg->next;
	}
	in_cursor = msg->act_msg;

	/* Add info to the message */
	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (blow_tag_lookup(tag)) {
				case BLOW_TAG_TARGET: {
					char m_name[80];
					if (midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf),
							&end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}
				case BLOW_TAG_OF_TARGET: {
					char m_name[80];
					if (midx > 0) {
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							MDESC_TARG | MDESC_POSS);
						strnfcat(buf, sizeof(buf), &end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "your");
					}
					break;
				}
				case BLOW_TAG_HAS: {
					if (midx > 0) {
						strnfcat(buf, sizeof(buf), &end, "has");
					} else {
						strnfcat(buf, sizeof(buf), &end, "have");
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);
	return string_make(buf);
}